

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSGlue::emitPostES6(Wasm2JSGlue *this)

{
  __node_base_ptr *pp_Var1;
  Name *this_00;
  variant<wasm::Name,_wasm::HeapType> *this_01;
  ExternalKind EVar2;
  _Head_base<0UL,_wasm::Function_*,_false> _Var3;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var4;
  _Head_base<0UL,_wasm::Export_*,_false> _Var5;
  bool bVar6;
  ostream *poVar7;
  size_type sVar8;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar10;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  pointer puVar11;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *import_1;
  pointer puVar12;
  Wasm2JSGlue *pWVar13;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar14;
  IString name;
  IString name_00;
  IString name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  __ireturn_type _Var15;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seenModules;
  string local_60;
  Wasm2JSGlue *local_40;
  pointer local_38;
  
  _Var9._M_head_impl = (Memory *)this->wasm;
  if ((*(pointer *)((long)(_Var9._M_head_impl + 1) + 0x20) !=
       *(pointer *)((long)(_Var9._M_head_impl + 1) + 0x28)) &&
     (*(char **)((long)&(((*(pointer *)((long)(_Var9._M_head_impl + 1) + 0x20))->_M_t).
                         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                        super_Importable + 0x20) != (char *)0x0)) {
    poVar7 = std::operator<<((ostream *)(this->out + 0x200),"var mem");
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(this->moduleName).super_IString.str._M_str,
                        (this->moduleName).super_IString.str._M_len);
    poVar7 = std::operator<<(poVar7," = new ArrayBuffer(");
    _Var9._M_head_impl =
         *(Memory **)
          &(((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7,");\n");
  }
  poVar7 = std::operator<<((ostream *)(this->out + 0x200),"var ret");
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->moduleName).super_IString.str._M_str,
                      (this->moduleName).super_IString.str._M_len);
  poVar7 = std::operator<<(poVar7," = ");
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->moduleName).super_IString.str._M_str,
                      (this->moduleName).super_IString.str._M_len);
  std::operator<<(poVar7,"({\n");
  local_b8 = (undefined1  [8])&seenModules._M_h._M_rehash_policy._M_next_resize;
  seenModules._M_h._M_buckets = (__buckets_ptr)0x1;
  seenModules._M_h._M_bucket_count = 0;
  seenModules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seenModules._M_h._M_element_count._0_4_ = 0x3f800000;
  seenModules._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seenModules._M_h._M_rehash_policy._4_4_ = 0;
  seenModules._M_h._M_rehash_policy._M_next_resize = 0;
  local_38 = (pointer)(this->wasm->functions).
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var1 = &seenModules._M_h._M_single_bucket;
  pcVar10 = extraout_RDX;
  local_40 = this;
  for (puVar14 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pWVar13 = local_40,
      (pointer)puVar14 != local_38; puVar14 = puVar14 + 1) {
    _Var3._M_head_impl =
         (puVar14->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
         ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var3._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      name.str._M_str = pcVar10;
      name.str._M_len = (size_t)*(char **)((long)&(_Var3._M_head_impl)->super_Importable + 0x30);
      bVar6 = ABI::wasm2js::isHelper
                        (*(wasm2js **)
                          &((Name *)((long)&(_Var3._M_head_impl)->super_Importable + 0x28))->
                           super_IString,name);
      pcVar10 = extraout_RDX_00;
      if (!bVar6) {
        this_00 = (Name *)((long)&(_Var3._M_head_impl)->super_Importable + 0x18);
        sVar8 = std::
                _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_b8,this_00);
        pcVar10 = extraout_RDX_01;
        if (sVar8 == 0) {
          poVar7 = std::operator<<((ostream *)(local_40->out + 0x200),"  \"");
          name_02.super_IString.str._M_str = (char *)_Var9._M_head_impl;
          name_02.super_IString.str._M_len =
               (size_t)*(char **)((long)&(_Var3._M_head_impl)->super_Importable + 0x20);
          poVar7 = wasm::operator<<((wasm *)poVar7,
                                    *(ostream **)
                                     &((Name *)((long)&(_Var3._M_head_impl)->super_Importable + 0x18
                                               ))->super_IString,name_02);
          poVar7 = std::operator<<(poVar7,"\": ");
          IString::toString_abi_cxx11_(&local_60,(IString *)this_00);
          ::wasm::asmangle(pp_Var1,&local_60);
          poVar7 = std::operator<<(poVar7,(string *)pp_Var1);
          std::operator<<(poVar7,",\n");
          std::__cxx11::string::~string((string *)pp_Var1);
          std::__cxx11::string::~string((string *)&local_60);
          _Var15 = std::__detail::
                   _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_b8,this_00);
          pcVar10 = _Var15._8_8_;
        }
      }
    }
  }
  local_38 = (pointer)(local_40->wasm->memories).
                      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var1 = &seenModules._M_h._M_single_bucket;
  for (puVar12 = (local_40->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; (pointer)puVar12 != local_38;
      puVar12 = puVar12 + 1) {
    _Var4._M_head_impl =
         (puVar12->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      name_00.str._M_str = pcVar10;
      name_00.str._M_len = (size_t)*(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x30);
      bVar6 = ABI::wasm2js::isHelper
                        (*(wasm2js **)
                          &((Name *)((long)&(_Var4._M_head_impl)->super_Importable + 0x28))->
                           super_IString,name_00);
      pcVar10 = extraout_RDX_02;
      if (!bVar6) {
        poVar7 = std::operator<<((ostream *)(pWVar13->out + 0x200),"  \"");
        name_03.super_IString.str._M_str = (char *)_Var9._M_head_impl;
        name_03.super_IString.str._M_len =
             (size_t)*(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x20);
        poVar7 = wasm::operator<<((wasm *)poVar7,
                                  *(ostream **)
                                   &((Name *)((long)&(_Var4._M_head_impl)->super_Importable + 0x18))
                                    ->super_IString,name_03);
        std::operator<<(poVar7,"\": {\n");
        poVar7 = std::operator<<((ostream *)(pWVar13->out + 0x200),"    ");
        IString::toString_abi_cxx11_
                  (&local_60,(IString *)((long)&(_Var4._M_head_impl)->super_Importable + 0x28));
        ::wasm::asmangle(pp_Var1,&local_60);
        poVar7 = std::operator<<(poVar7,(string *)pp_Var1);
        poVar7 = std::operator<<(poVar7,": { buffer : mem");
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(pWVar13->moduleName).super_IString.str._M_str,
                            (pWVar13->moduleName).super_IString.str._M_len);
        std::operator<<(poVar7," }\n");
        std::__cxx11::string::~string((string *)pp_Var1);
        std::__cxx11::string::~string((string *)&local_60);
        std::operator<<((ostream *)(pWVar13->out + 0x200),"  },\n");
        pcVar10 = extraout_RDX_03;
      }
    }
  }
  local_38 = (pointer)(pWVar13->wasm->tables).
                      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var1 = &seenModules._M_h._M_single_bucket;
  for (puVar11 = (pointer)(pWVar13->wasm->tables).
                          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; pWVar13 = local_40,
      puVar11 != local_38; puVar11 = puVar11 + 1) {
    _Var5._M_head_impl =
         (puVar11->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (*(long *)((long)&(_Var5._M_head_impl)->value + 8) != 0) {
      name_01.str._M_str = pcVar10;
      name_01.str._M_len = *(size_t *)&_Var5._M_head_impl[1].name;
      bVar6 = ABI::wasm2js::isHelper
                        (*(wasm2js **)((long)&(_Var5._M_head_impl)->value + 0x10),name_01);
      pcVar10 = extraout_RDX_04;
      if (!bVar6) {
        this_01 = &(_Var5._M_head_impl)->value;
        sVar8 = std::
                _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_b8,(key_type *)this_01);
        pcVar10 = extraout_RDX_05;
        if (sVar8 == 0) {
          poVar7 = std::operator<<((ostream *)(local_40->out + 0x200),"  \"");
          name_04.super_IString.str._M_str = (char *)_Var9._M_head_impl;
          name_04.super_IString.str._M_len = *(size_t *)((long)&(_Var5._M_head_impl)->value + 8);
          poVar7 = wasm::operator<<((wasm *)poVar7,
                                    *(ostream **)
                                     &((_Var5._M_head_impl)->value).
                                      super__Variant_base<wasm::Name,_wasm::HeapType>,name_04);
          poVar7 = std::operator<<(poVar7,"\": ");
          IString::toString_abi_cxx11_(&local_60,(IString *)this_01);
          ::wasm::asmangle(pp_Var1,&local_60);
          poVar7 = std::operator<<(poVar7,(string *)pp_Var1);
          std::operator<<(poVar7,",\n");
          std::__cxx11::string::~string((string *)pp_Var1);
          std::__cxx11::string::~string((string *)&local_60);
          _Var15 = std::__detail::
                   _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_b8,(value_type *)this_01);
          pcVar10 = _Var15._8_8_;
        }
      }
    }
  }
  std::operator<<((ostream *)(local_40->out + 0x200),"});\n");
  if ((pWVar13->flags).allowAsserts == false) {
    local_38 = (pWVar13->wasm->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar11 = (pWVar13->wasm->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != local_38;
        puVar11 = puVar11 + 1) {
      EVar2 = ((puVar11->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind;
      if (((uint)EVar2 < 4) && (EVar2 != Table)) {
        pp_Var1 = &seenModules._M_h._M_single_bucket;
        poVar7 = std::operator<<((ostream *)(pWVar13->out + 0x200),"export var ");
        IString::toString_abi_cxx11_
                  (&local_d8,
                   (IString *)
                   (puVar11->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
        ::wasm::asmangle(pp_Var1,&local_d8);
        poVar7 = std::operator<<(poVar7,(string *)pp_Var1);
        poVar7 = std::operator<<(poVar7," = ret");
        name_05.super_IString.str._M_str = (char *)local_40;
        name_05.super_IString.str._M_len = (size_t)(local_40->moduleName).super_IString.str._M_str;
        poVar7 = wasm::operator<<((wasm *)poVar7,
                                  (ostream *)(local_40->moduleName).super_IString.str._M_len,name_05
                                 );
        poVar7 = std::operator<<(poVar7,".");
        IString::toString_abi_cxx11_
                  (&local_f8,
                   (IString *)
                   (puVar11->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
        ::wasm::asmangle(&local_60,&local_f8);
        poVar7 = std::operator<<(poVar7,(string *)&local_60);
        std::operator<<(poVar7,";\n");
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&seenModules._M_h._M_single_bucket);
        std::__cxx11::string::~string((string *)&local_d8);
        pWVar13 = local_40;
      }
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_b8);
  return;
}

Assistant:

void Wasm2JSGlue::emitPostES6() {
  // Create an initial `ArrayBuffer` and populate it with static data.
  // Currently we use base64 encoding to encode static data and we decode it at
  // instantiation time.
  //
  // Note that the translation here expects that the lower values of this memory
  // can be used for conversions, so make sure there's at least one page.
  if (!wasm.memories.empty() && wasm.memories[0]->imported()) {
    out << "var mem" << moduleName.str << " = new ArrayBuffer("
        << wasm.memories[0]->initial.addr * Memory::kPageSize << ");\n";
  }

  // Actually invoke the `asmFunc` generated function, passing in all global
  // values followed by all imports
  out << "var ret" << moduleName.str << " = " << moduleName.str << "({\n";

  std::unordered_set<Name> seenModules;

  ModuleUtils::iterImportedFunctions(wasm, [&](Function* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  ModuleUtils::iterImportedMemories(wasm, [&](Memory* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    out << "  \"" << import->module << "\": {\n";
    out << "    " << asmangle(import->base.toString()) << ": { buffer : mem"
        << moduleName.str << " }\n";
    out << "  },\n";
  });

  ModuleUtils::iterImportedTables(wasm, [&](Table* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  out << "});\n";

  if (flags.allowAsserts) {
    return;
  }

  // And now that we have our returned instance, export all our functions
  // that are hanging off it.
  for (auto& exp : wasm.exports) {
    switch (exp->kind) {
      case ExternalKind::Function:
      case ExternalKind::Global:
      case ExternalKind::Memory:
        break;

      // Exported globals and function tables aren't supported yet
      default:
        continue;
    }
    out << "export var " << asmangle(exp->name.toString()) << " = ret"
        << moduleName << "." << asmangle(exp->name.toString()) << ";\n";
  }
}